

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::torrent::is_seed(torrent *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer ppVar4;
  torrent *this_local;
  
  bVar1 = valid_metadata(this);
  if (bVar1) {
    if (((byte)this->field_0x5cc >> 2 & 1) == 0) {
      if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1e & 1) == 0) {
        bVar1 = ::std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr *)&this->super_torrent_hot_members);
        if (bVar1) {
          ppVar4 = ::std::
                   unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ::operator->(&(this->super_torrent_hot_members).m_picker);
          iVar2 = piece_picker::num_passed(ppVar4);
          ppVar4 = ::std::
                   unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ::operator->(&(this->super_torrent_hot_members).m_picker);
          iVar3 = piece_picker::num_pieces(ppVar4);
          if (iVar2 == iVar3) {
            return true;
          }
        }
        this_local._7_1_ =
             ((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48 >> 0x39) &
             7) == 5;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool torrent::is_seed() const
	{
		if (!valid_metadata()) return false;
		if (m_seed_mode) return true;
		if (m_have_all) return true;
		if (m_picker && m_picker->num_passed() == m_picker->num_pieces()) return true;
		return m_state == torrent_status::seeding;
	}